

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O2

int VP8GetCostLuma16(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *pVVar2;
  int iVar3;
  long lVar4;
  int16_t (*paiVar5) [16];
  int16_t (*paiVar6) [16];
  long lVar7;
  int local_6c;
  VP8Residual res;
  
  pVVar2 = it->enc_;
  VP8IteratorNzToBytes(it);
  res.coeff_type = 1;
  res.prob = (pVVar2->proba_).coeffs_[1];
  res.stats = (pVVar2->proba_).stats_[1];
  res.costs = (pVVar2->proba_).remapped_costs_[1];
  res.first = 0;
  (*VP8SetResidualCoeffs)(rd->y_dc_levels,&res);
  local_6c = (*VP8GetResidualCost)(it->left_nz_[8] + it->top_nz_[8],&res);
  res.coeff_type = 0;
  res.first = 1;
  paiVar5 = rd->y_ac_levels;
  lVar4 = 0;
  res.prob = (pVVar2->proba_).coeffs_[0];
  res.stats = (pVVar2->proba_).stats_[0];
  res.costs = (pVVar2->proba_).remapped_costs_[0];
  for (; lVar4 != 4; lVar4 = lVar4 + 1) {
    paiVar6 = paiVar5;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      iVar3 = it->left_nz_[lVar4];
      iVar1 = it->top_nz_[lVar7];
      (*VP8SetResidualCoeffs)(*paiVar6,&res);
      iVar3 = (*VP8GetResidualCost)(iVar3 + iVar1,&res);
      local_6c = local_6c + iVar3;
      it->left_nz_[lVar4] = (uint)~res.last >> 0x1f;
      it->top_nz_[lVar7] = (uint)~res.last >> 0x1f;
      paiVar6 = paiVar6 + 1;
    }
    paiVar5 = paiVar5 + 4;
  }
  return local_6c;
}

Assistant:

int VP8GetCostLuma16(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);   // re-import the non-zero context

  // DC
  VP8InitResidual(0, 1, enc, &res);
  VP8SetResidualCoeffs(rd->y_dc_levels, &res);
  R += VP8GetResidualCost(it->top_nz_[8] + it->left_nz_[8], &res);

  // AC
  VP8InitResidual(1, 0, enc, &res);
  for (y = 0; y < 4; ++y) {
    for (x = 0; x < 4; ++x) {
      const int ctx = it->top_nz_[x] + it->left_nz_[y];
      VP8SetResidualCoeffs(rd->y_ac_levels[x + y * 4], &res);
      R += VP8GetResidualCost(ctx, &res);
      it->top_nz_[x] = it->left_nz_[y] = (res.last >= 0);
    }
  }
  return R;
}